

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O2

void Eigen::internal::
     generic_product_impl<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::MatrixWrapper<Eigen::Array<double,-1,1,0,-1,1>>,Eigen::DenseShape,Eigen::DenseShape,7>
     ::scaleAndAddTo<Eigen::Matrix<double,_1,1,0,_1,1>>
               (Matrix<double,__1,_1,_0,__1,_1> *dst,Matrix<double,__1,__1,_0,__1,__1> *lhs,
               MatrixWrapper<Eigen::Array<double,__1,_1,_0,__1,_1>_> *rhs,Scalar *alpha)

{
  double dVar1;
  double *pdVar2;
  ReturnType RVar3;
  RhsNested actual_rhs;
  MatrixWrapper<Eigen::Array<double,__1,_1,_0,__1,_1>_> local_90 [7];
  BlockImpl_dense<const_Eigen::MatrixWrapper<Eigen::Array<double,__1,_1,_0,__1,_1>_>,__1,_1,_true,_true>
  local_58;
  
  if ((lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows == 1)
  {
    dVar1 = *alpha;
    Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
              ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_90,lhs,0
              );
    BlockImpl_dense<const_Eigen::MatrixWrapper<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>,_-1,_1,_true,_true>
    ::BlockImpl_dense(&local_58,rhs,0);
    RVar3 = MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>>::
            dot<Eigen::Block<Eigen::MatrixWrapper<Eigen::Array<double,_1,1,0,_1,1>>const,_1,1,true>>
                      ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>>
                        *)local_90,
                       (MatrixBase<Eigen::Block<const_Eigen::MatrixWrapper<Eigen::Array<double,__1,_1,_0,__1,_1>_>,__1,_1,_true>_>
                        *)&local_58);
    pdVar2 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    *pdVar2 = RVar3 * dVar1 + *pdVar2;
  }
  else {
    local_90[0] = (MatrixWrapper<Eigen::Array<double,__1,_1,_0,__1,_1>_>)rhs->m_expression;
    gemv_dense_selector<2,0,true>::
    run<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::MatrixWrapper<Eigen::Array<double,_1,1,0,_1,1>>,Eigen::Matrix<double,_1,1,0,_1,1>>
              (lhs,local_90,dst,alpha);
  }
  return;
}

Assistant:

static EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void scaleAndAddTo(Dest& dst, const Lhs& lhs, const Rhs& rhs, const Scalar& alpha)
  {
    // Fallback to inner product if both the lhs and rhs is a runtime vector.
    if (lhs.rows() == 1 && rhs.cols() == 1) {
      dst.coeffRef(0,0) += alpha * lhs.row(0).conjugate().dot(rhs.col(0));
      return;
    }
    LhsNested actual_lhs(lhs);
    RhsNested actual_rhs(rhs);
    internal::gemv_dense_selector<Side,
                            (int(MatrixType::Flags)&RowMajorBit) ? RowMajor : ColMajor,
                            bool(internal::blas_traits<MatrixType>::HasUsableDirectAccess)
                           >::run(actual_lhs, actual_rhs, dst, alpha);
  }